

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
::resize(raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         *this,size_t new_capacity)

{
  CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *alloc;
  ctrl_t *p;
  size_t capacity;
  size_t hashval;
  size_t i;
  size_t sVar1;
  slot_type *old_slot;
  FindInfo FVar2;
  Layout LVar3;
  HashElement local_38;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    p = this->ctrl_;
    old_slot = this->slots_;
    capacity = this->capacity_;
    initialize_slots(this,new_capacity);
    this->capacity_ = new_capacity;
    alloc = &this->settings_;
    for (sVar1 = 0; capacity != sVar1; sVar1 = sVar1 + 1) {
      if (-1 < p[sVar1]) {
        local_38.h = (hasher *)alloc;
        hashval = DecomposePair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>::HashElement,std::pair<std::__cxx11::string_const,unsigned_long>&>
                            (&local_38,&old_slot->value);
        FVar2 = find_first_non_full(this,hashval);
        set_ctrl(this,FVar2.offset,(byte)hashval & 0x7f);
        map_slot_policy<std::__cxx11::string,unsigned_long>::
        transfer<std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                  ((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                    *)alloc,this->slots_ + FVar2.offset,old_slot);
      }
      old_slot = old_slot + 1;
    }
    if (capacity != 0) {
      LVar3 = MakeLayout(capacity);
      Deallocate<8ul,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                ((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                  *)alloc,p,
                 LVar3.
                 super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<std::__cxx11::basic_string<char>,_unsigned_long>_>
                 .size_[1] * 0x28 +
                 (LVar3.
                  super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<std::__cxx11::basic_string<char>,_unsigned_long>_>
                  .size_[0] + 7 & 0xfffffffffffffff8));
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                ,0x8dd,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::basic_string<char>, unsigned long>, phmap::Hash<std::basic_string<char>>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, unsigned long>>>::resize(size_t) [Policy = phmap::priv::FlatHashMapPolicy<std::basic_string<char>, unsigned long>, Hash = phmap::Hash<std::basic_string<char>>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, unsigned long>>]"
               );
}

Assistant:

void resize(size_t new_capacity)
			{
				assert(IsValidCapacity(new_capacity));
				auto* old_ctrl = ctrl_;
				auto* old_slots = slots_;
				const size_t old_capacity = capacity_;
				initialize_slots(new_capacity);
				capacity_ = new_capacity;

				for (size_t i = 0; i != old_capacity; ++i) {
					if (IsFull(old_ctrl[i])) {
						size_t hashval = PolicyTraits::apply(HashElement{hash_ref()},
						                                     PolicyTraits::element(old_slots + i));
						auto target = find_first_non_full(hashval);
						size_t new_i = target.offset;
						set_ctrl(new_i, H2(hashval));
						PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, old_slots + i);
					}
				}
				if (old_capacity) {
					SanitizerUnpoisonMemoryRegion(old_slots,
					                              sizeof(slot_type) * old_capacity);
					auto layout = MakeLayout(old_capacity);
					Deallocate<Layout::Alignment()>(&alloc_ref(), old_ctrl,
					                                layout.AllocSize());
				}
			}